

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

ssize_t __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::RpcRequest::send
          (RpcRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ushort uVar1;
  RpcConnectionState *pRVar2;
  RpcClient *pRVar3;
  void *pvVar4;
  undefined8 uVar5;
  PointerReader other;
  PromiseNode *pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t sVar9;
  TransformPromiseNodeBase *this_00;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  RpcRequest *this_01;
  int __flags_00;
  anon_union_344_2_a774ebf0_for_OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,_kj::Exception>_3
  *other_00;
  MessageSizeCounts MVar10;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline> OVar11;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline> pipeline;
  Request<capnp::AnyPointer,_capnp::AnyPointer> replacement;
  ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
  forkedPromise;
  Own<kj::_::PromiseNode> local_360;
  undefined1 local_350 [48];
  undefined1 local_320 [344];
  Exception local_1c8;
  undefined1 local_70 [8];
  PipelineHook *local_68;
  uint local_60;
  StructBuilder local_58;
  
  this_01 = (RpcRequest *)CONCAT44(in_register_00000034,__fd);
  pRVar2 = (this_01->connectionState).ptr;
  if ((pRVar2->connection).tag == 1) {
    pRVar3 = (this_01->target).ptr;
    local_320._0_8_ = (this_01->callBuilder)._builder.segment;
    local_320._8_8_ = (this_01->callBuilder)._builder.capTable;
    local_320._16_8_ = (this_01->callBuilder)._builder.pointers;
    PointerBuilder::getStruct(&local_58,(PointerBuilder *)local_320,(StructSize)0x10001,(word *)0x0)
    ;
    (*(pRVar3->super_ClientHook)._vptr_ClientHook[8])(local_320,pRVar3);
    uVar8 = local_320._8_8_;
    uVar7 = local_320._0_8_;
    if ((QuestionRef *)local_320._8_8_ == (QuestionRef *)0x0) {
      sendInternal((SendInternalResult *)local_320,this_01,false);
      kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>::fork
                ((Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                  *)&local_1c8);
      pRVar2 = (this_01->connectionState).ptr;
      kj::ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
      ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                   *)&local_360);
      OVar11 = kj::
               refcounted<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcPipeline,capnp::_::(anonymous_namespace)::RpcConnectionState&,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef>,kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>>>
                         ((RpcConnectionState *)local_350,
                          (Own<capnp::_::(anonymous_namespace)::RpcConnectionState::QuestionRef> *)
                          pRVar2,(Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                                  *)local_320);
      pPVar6 = local_360.ptr;
      if (local_360.ptr != (PromiseNode *)0x0) {
        local_360.ptr = (PromiseNode *)0x0;
        (**(local_360.disposer)->_vptr_Disposer)
                  (local_360.disposer,
                   (_func_int *)
                   ((long)&pPVar6->_vptr_PromiseNode + (long)pPVar6->_vptr_PromiseNode[-2]),
                   OVar11.ptr);
      }
      kj::ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
      ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                   *)&local_360);
      this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_360,
                 kj::_::
                 TransformPromiseNode<capnp::Response<capnp::AnyPointer>,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:1430:13),_kj::_::PropagateException>
                 ::anon_class_1_0_00000001_for_func::operator());
      pPVar6 = local_360.ptr;
      (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00644ce0;
      if (local_360.ptr != (PromiseNode *)0x0) {
        local_360.ptr = (PromiseNode *)0x0;
        (**(local_360.disposer)->_vptr_Disposer)
                  (local_360.disposer,
                   (_func_int *)
                   ((long)&pPVar6->_vptr_PromiseNode + (long)pPVar6->_vptr_PromiseNode[-2]));
      }
      sVar9 = local_1c8.ownFile.content.size_;
      uVar5 = local_350._8_8_;
      local_350._8_8_ = (Disposer *)0x0;
      (this->super_RequestHook)._vptr_RequestHook =
           (_func_int **)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<capnp::Response<capnp::AnyPointer>,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,capnp::_::(anonymous_namespace)::RpcConnectionState::RpcRequest::send()::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>&&)#1},kj::_::PropagateException>>
            ::instance;
      (this->connectionState).disposer = (Disposer *)this_00;
      (this->connectionState).ptr = (RpcConnectionState *)local_350._0_8_;
      (this->target).disposer = (Disposer *)uVar5;
      (this->target).ptr = (RpcClient *)0x0;
      (this->message).disposer = (Disposer *)0x0;
      (this->message).ptr = (OutgoingRpcMessage *)0x0;
      if ((Disposer *)local_1c8.ownFile.content.size_ != (Disposer *)0x0) {
        local_1c8.ownFile.content.size_ = 0;
        (**(code **)*(_func_int **)local_1c8.ownFile.content.ptr)
                  (local_1c8.ownFile.content.ptr,(*(_func_int ***)sVar9)[-2] + sVar9);
      }
      uVar5 = local_320._24_8_;
      if ((PromiseNode *)local_320._24_8_ != (PromiseNode *)0x0) {
        local_320._24_8_ = (PromiseNode *)0x0;
        (*(code *)**(undefined8 **)(WireValue<uint32_t>_conflict *)local_320._16_8_)
                  (local_320._16_8_,(*(_func_int ***)uVar5)[-2] + (long)(_func_int ***)uVar5);
      }
      uVar5 = local_320._8_8_;
      if ((QuestionRef *)local_320._8_8_ != (QuestionRef *)0x0) {
        local_320._8_8_ = (QuestionRef *)0x0;
        (*(code *)**(undefined8 **)local_320._0_8_)
                  (local_320._0_8_,(*(_func_int ***)uVar5)[-2] + uVar5);
      }
    }
    else {
      pvVar4 = (this_01->callBuilder)._builder.data;
      uVar5 = *(undefined8 *)((long)pvVar4 + 8);
      uVar1 = *(ushort *)((long)pvVar4 + 4);
      PointerBuilder::asReader(&(this_01->paramsBuilder).builder);
      MVar10 = PointerReader::targetSize((PointerReader *)&local_1c8);
      local_68 = (PipelineHook *)MVar10.wordCount;
      __flags_00 = (int)local_70;
      local_70[0] = 1;
      local_60 = MVar10.capCount;
      __n_00 = (size_t)uVar1;
      (***(_func_int ***)uVar8)(local_320,uVar8,uVar5);
      PointerBuilder::asReader(&(this_01->paramsBuilder).builder);
      other.capTable._0_4_ = (int)local_350._24_8_;
      other.segment = (SegmentReader *)local_350._16_8_;
      other.capTable._4_4_ = SUB84(local_350._24_8_,4);
      other.pointer._0_4_ = (int)local_350._32_8_;
      other.pointer._4_4_ = SUB84(local_350._32_8_,4);
      other.nestingLimit = (int)local_350._40_8_;
      other._28_4_ = SUB84(local_350._40_8_,4);
      PointerBuilder::copyFrom((PointerBuilder *)local_320,other,false);
      Request<capnp::AnyPointer,_capnp::AnyPointer>::send
                ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)this,(int)local_320,__buf_00,
                 __n_00,__flags_00);
      uVar5 = local_320._32_8_;
      if ((long *)local_320._32_8_ != (long *)0x0) {
        local_320._32_8_ = (long *)0x0;
        (***(_func_int ***)local_320._24_8_)
                  (local_320._24_8_,uVar5 + *(long *)(*(long *)uVar5 + -0x10));
      }
    }
    if ((QuestionRef *)uVar8 != (QuestionRef *)0x0) {
      (*(code *)**(undefined8 **)uVar7)(uVar7,(*(_func_int ***)uVar8)[-2] + uVar8);
    }
  }
  else {
    other_00 = &(pRVar2->connection).field_1;
    kj::Exception::Exception((Exception *)local_320,(Exception *)other_00);
    kj::heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>
              ((kj *)&local_1c8,(Exception *)local_320);
    kj::Exception::Exception(&local_1c8,(Exception *)other_00);
    newBrokenPipeline((capnp *)local_350,&local_1c8);
    (this->super_RequestHook)._vptr_RequestHook = (_func_int **)local_1c8.ownFile.content.ptr;
    (this->connectionState).disposer = (Disposer *)local_1c8.ownFile.content.size_;
    (this->connectionState).ptr = (RpcConnectionState *)local_350._0_8_;
    (this->target).disposer = (Disposer *)local_350._8_8_;
    (this->target).ptr = (RpcClient *)0x0;
    (this->message).disposer = (Disposer *)0x0;
    (this->message).ptr = (OutgoingRpcMessage *)0x0;
    local_350._8_8_ = (_func_int **)0x0;
    kj::Exception::~Exception(&local_1c8);
    kj::Exception::~Exception((Exception *)local_320);
  }
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
      if (!connectionState->connection.is<Connected>()) {
        // Connection is broken.
        const kj::Exception& e = connectionState->connection.get<Disconnected>();
        return RemotePromise<AnyPointer>(
            kj::Promise<Response<AnyPointer>>(kj::cp(e)),
            AnyPointer::Pipeline(newBrokenPipeline(kj::cp(e))));
      }

      KJ_IF_MAYBE(redirect, target->writeTarget(callBuilder.getTarget())) {
        // Whoops, this capability has been redirected while we were building the request!
        // We'll have to make a new request and do a copy.  Ick.

        auto replacement = redirect->get()->newCall(
            callBuilder.getInterfaceId(), callBuilder.getMethodId(), paramsBuilder.targetSize());
        replacement.set(paramsBuilder);
        return replacement.send();
      } else {
        auto sendResult = sendInternal(false);

        auto forkedPromise = sendResult.promise.fork();

        // The pipeline must get notified of resolution before the app does to maintain ordering.
        auto pipeline = kj::refcounted<RpcPipeline>(
            *connectionState, kj::mv(sendResult.questionRef), forkedPromise.addBranch());

        auto appPromise = forkedPromise.addBranch().then(
            [=](kj::Own<RpcResponse>&& response) {
              auto reader = response->getResults();
              return Response<AnyPointer>(reader, kj::mv(response));
            });

        return RemotePromise<AnyPointer>(
            kj::mv(appPromise),
            AnyPointer::Pipeline(kj::mv(pipeline)));
      }